

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add.cpp
# Opt level: O1

bool duckdb::TryDecimalAdd::Operation<long,long,long>(int64_t left,int64_t right,int64_t *result)

{
  if (right < 0) {
    if (-999999999999999999 - right <= left) goto LAB_014393cc;
  }
  else if (left <= 999999999999999999 - right) {
LAB_014393cc:
    *result = right + left;
    return true;
  }
  return false;
}

Assistant:

bool TryDecimalAddTemplated(T left, T right, T &result) {
	if (right < 0) {
		if (min - right > left) {
			return false;
		}
	} else {
		if (max - right < left) {
			return false;
		}
	}
	result = left + right;
	return true;
}